

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  ulong uVar4;
  uint32_t *puVar5;
  long lVar6;
  long lVar7;
  undefined1 local_158 [8];
  mbedtls_aes_context cty;
  
  memset((mbedtls_aes_context *)local_158,0,0x120);
  ctx->rk_offset = 0;
  uVar2 = mbedtls_aes_setkey_enc((mbedtls_aes_context *)local_158,key,keybits);
  if (uVar2 == 0) {
    uVar4 = (ulong)(int)local_158._0_4_;
    ctx->nr = local_158._0_4_;
    puVar3 = (uint32_t *)(local_158 + uVar4 * 0x10 + cty._0_8_ * 4);
    ctx->buf[0] = cty.buf[cty._0_8_ + uVar4 * 4 + -2];
    ctx->buf[1] = cty.buf[cty._0_8_ + uVar4 * 4 + -1];
    ctx->buf[2] = cty.buf[cty._0_8_ + uVar4 * 4];
    ctx->buf[3] = cty.buf[cty._0_8_ + uVar4 * 4 + 1];
    puVar5 = ctx->buf + 4;
    cty.buf[0x43] = uVar2;
    while (1 < (int)uVar4) {
      uVar4 = (ulong)((int)uVar4 - 1);
      lVar6 = 0;
      for (lVar7 = 0; (int)lVar7 != 4; lVar7 = lVar7 + 1) {
        uVar1 = puVar3[lVar7];
        puVar5[lVar7] =
             RT1[FSb[uVar1 >> 8 & 0xff]] ^ RT0[FSb[uVar1 & 0xff]] ^ RT2[FSb[uVar1 >> 0x10 & 0xff]] ^
             RT3[FSb[uVar1 >> 0x18]];
        lVar6 = lVar6 + -4;
      }
      puVar3 = (uint32_t *)((long)puVar3 + (-0x20 - lVar6));
      puVar5 = (uint32_t *)((long)puVar5 - lVar6);
      uVar2 = cty.buf[0x43];
    }
    *puVar5 = *puVar3;
    puVar5[1] = puVar3[1];
    puVar5[2] = puVar3[2];
    puVar5[3] = puVar3[3];
  }
  mbedtls_aes_free((mbedtls_aes_context *)local_158);
  return uVar2;
}

Assistant:

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx, const unsigned char *key,
                           unsigned int keybits)
{
#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    uint32_t *SK;
#endif
    int ret;
    mbedtls_aes_context cty;
    uint32_t *RK;


    mbedtls_aes_init(&cty);

    ctx->rk_offset = mbedtls_aes_rk_offset(ctx->buf);
    RK = ctx->buf + ctx->rk_offset;

    /* Also checks keybits */
    if ((ret = mbedtls_aes_setkey_enc(&cty, key, keybits)) != 0) {
        goto exit;
    }

    ctx->nr = cty.nr;

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        mbedtls_aesni_inverse_key((unsigned char *) RK,
                                  (const unsigned char *) (cty.buf + cty.rk_offset), ctx->nr);
        goto exit;
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        mbedtls_aesce_inverse_key(
            (unsigned char *) RK,
            (const unsigned char *) (cty.buf + cty.rk_offset),
            ctx->nr);
        goto exit;
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    SK = cty.buf + cty.rk_offset + cty.nr * 4;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    SK -= 8;
    for (int i = ctx->nr - 1; i > 0; i--, SK -= 8) {
        for (int j = 0; j < 4; j++, SK++) {
            *RK++ = AES_RT0(FSb[MBEDTLS_BYTE_0(*SK)]) ^
                    AES_RT1(FSb[MBEDTLS_BYTE_1(*SK)]) ^
                    AES_RT2(FSb[MBEDTLS_BYTE_2(*SK)]) ^
                    AES_RT3(FSb[MBEDTLS_BYTE_3(*SK)]);
        }
    }

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
exit:
    mbedtls_aes_free(&cty);

    return ret;
}